

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O2

void __thiscall
amrex::CellConservativeLinear::interp
          (CellConservativeLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,int fine_comp,
          int ncomp,Box *fine_region,IntVect *ratio,Geometry *crse_geom,Geometry *fine_geom,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,int param_11,int param_12,
          RunOn runon)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  double *pdVar14;
  double *pdVar15;
  pointer pBVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  int koff;
  int iVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  pointer pBVar50;
  int iVar51;
  int iVar52;
  uint uVar53;
  ulong uVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  double *pdVar58;
  uint uVar59;
  long lVar60;
  int *piVar61;
  int iVar62;
  uint uVar63;
  long lVar64;
  long lVar65;
  ulong uVar66;
  ulong uVar67;
  int iVar68;
  uint uVar69;
  long lVar70;
  ulong uVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  uint uVar79;
  long lVar80;
  double *pdVar81;
  bool bVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar93;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  double *local_440;
  double *local_418;
  ulong local_3f0;
  double *local_378;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  double *local_318;
  double *local_310;
  double *local_308;
  long local_298;
  int local_288;
  Box result;
  long local_170;
  long local_168;
  long local_160;
  AsyncArray<amrex::BCRec,_0> async_bcr;
  Elixir cceli;
  FArrayBox ccfab;
  undefined1 local_4c [8];
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  undefined8 uStack_38;
  
  pdVar14 = (crse->super_BaseFab<double>).dptr;
  uVar2 = (crse->super_BaseFab<double>).domain.smallend.vect[0];
  lVar19 = (long)(int)uVar2;
  uVar3 = (crse->super_BaseFab<double>).domain.smallend.vect[1];
  lVar20 = (long)(int)uVar3;
  uVar4 = (crse->super_BaseFab<double>).domain.smallend.vect[2];
  lVar21 = (long)(int)uVar4;
  iVar5 = (crse->super_BaseFab<double>).domain.bigend.vect[0];
  iVar6 = (crse->super_BaseFab<double>).domain.bigend.vect[1];
  iVar7 = (crse->super_BaseFab<double>).domain.bigend.vect[2];
  pdVar15 = (fine->super_BaseFab<double>).dptr;
  iVar8 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
  iVar9 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
  iVar10 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  iVar11 = (fine->super_BaseFab<double>).domain.bigend.vect[0];
  iVar31 = (fine->super_BaseFab<double>).domain.bigend.vect[1];
  iVar12 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
  (*(this->super_Interpolater).super_InterpBase._vptr_InterpBase[3])
            (local_4c,this,fine_region,ratio);
  result.bigend.vect[2] = (int)uStack_38;
  result.btype.itype = (uint)((ulong)uStack_38 >> 0x20);
  result.smallend.vect[0] = local_4c._0_4_;
  result.smallend.vect[1] = local_4c._4_4_;
  result.smallend.vect[0] = result.smallend.vect[0] + 1;
  result.smallend.vect[1] = result.smallend.vect[1] + 1;
  result.smallend.vect[2] = iStack_44 + 1;
  result.bigend.vect[0] = iStack_40 + -1;
  result.bigend.vect[1] = iStack_3c + -1;
  result.bigend.vect[2] = result.bigend.vect[2] + -1;
  async_bcr.d_data = (BCRec *)0x0;
  async_bcr.h_data = (BCRec *)0x0;
  pBVar16 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  FArrayBox::FArrayBox(&ccfab,&result,ncomp * 3,true,false,(Arena *)0x0);
  iVar51 = iVar5 + 1;
  iVar29 = iVar6 + 1;
  lVar72 = (long)(int)(iVar51 - uVar2);
  lVar73 = (long)(int)(iVar29 - uVar3);
  lVar74 = lVar73 * lVar72;
  lVar22 = (long)(int)((iVar7 - uVar4) + 1);
  lVar33 = lVar74 * lVar22;
  cceli.m_pa.
  super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
  .
  super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cceli.m_pa.
  super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
  .
  super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cceli.m_pa.
  super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
  .
  super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar23 = (long)ccfab.super_BaseFab<double>.domain.smallend.vect[0];
  lVar64 = (long)ccfab.super_BaseFab<double>.domain.smallend.vect[1];
  lVar80 = (long)((ccfab.super_BaseFab<double>.domain.bigend.vect[0] -
                  ccfab.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
  lVar37 = (long)((ccfab.super_BaseFab<double>.domain.bigend.vect[1] -
                  ccfab.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
  lVar38 = lVar37 * lVar80;
  lVar42 = (long)ccfab.super_BaseFab<double>.domain.smallend.vect[2];
  lVar55 = (long)((ccfab.super_BaseFab<double>.domain.bigend.vect[2] -
                  ccfab.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
  lVar70 = lVar38 * lVar55;
  lVar43 = (long)iVar51;
  lVar44 = (long)((iVar11 - iVar8) + 1);
  lVar45 = (long)((iVar31 - iVar9) + 1);
  iVar11 = (crse_geom->domain).smallend.vect[0];
  lVar60 = (long)iVar11;
  lVar46 = (long)(crse_geom->domain).smallend.vect[1];
  lVar47 = (long)(crse_geom->domain).smallend.vect[2];
  iVar31 = (crse_geom->domain).bigend.vect[0];
  lVar77 = (long)iVar31;
  lVar48 = (long)(crse_geom->domain).bigend.vect[1];
  lVar49 = (long)(crse_geom->domain).bigend.vect[2];
  if (this->do_linear_limiting == false) {
    iVar5 = ratio->vect[1];
    local_3f0 = 0;
    if (0 < ncomp) {
      local_3f0 = (ulong)(uint)ncomp;
    }
    iVar6 = ratio->vect[2];
    iVar11 = ratio->vect[0];
    for (uVar27 = 0; uVar27 != local_3f0; uVar27 = uVar27 + 1) {
      iVar31 = (int)uVar27;
      pBVar50 = pBVar16 + uVar27;
      lVar37 = (crse_comp + iVar31) * lVar33;
      lVar22 = (long)result.smallend.vect[2];
      while (lVar55 = lVar22, lVar55 <= result.bigend.vect[2]) {
        iVar51 = (int)lVar55 - uVar4;
        lVar65 = iVar51 * lVar74;
        lVar73 = (lVar55 - lVar42) * lVar38;
        lVar22 = (long)result.smallend.vect[1];
        while (lVar28 = lVar22, lVar22 = lVar55 + 1, lVar28 <= result.bigend.vect[1]) {
          if (result.bigend.vect[0] < result.smallend.vect[0]) {
            lVar22 = lVar28 + 1;
          }
          else {
            iVar62 = (int)lVar28 - uVar3;
            lVar25 = iVar62 * lVar72;
            lVar34 = (lVar28 - lVar64) * lVar80;
            lVar24 = (long)result.smallend.vect[0];
            iVar68 = ~uVar2 + result.smallend.vect[0];
            do {
              iVar52 = (int)(lVar24 + 1);
              dVar83 = pdVar14[lVar25 + lVar65 + lVar37 + (int)(iVar52 - uVar2)];
              dVar89 = pdVar14[lVar25 + lVar65 + lVar37 + (int)(~uVar2 + (int)lVar24)];
              dVar88 = (dVar83 - dVar89) * 0.5;
              if ((lVar24 == lVar60) && (pBVar50->bc[0] - 3U < 2)) {
                if (lVar60 + 2 < lVar43) {
                  dVar88 = pdVar14[lVar25 + lVar65 + lVar37 + ((lVar60 + 2) - lVar19)] * -0.1 +
                           dVar83 * 0.6666666666666666 +
                           dVar89 * -1.0666666666666667 +
                           pdVar14[lVar25 + lVar65 + lVar37 + (lVar60 - lVar19)] * 0.5;
                }
                else {
                  dVar88 = (dVar89 * -6.0 +
                           pdVar14[lVar25 + lVar65 + lVar37 + (lVar60 - lVar19)] * 5.0 + dVar83) *
                           0.25;
                }
              }
              if ((lVar24 == lVar77) && (pBVar50->bc[3] - 3U < 2)) {
                if (lVar77 + -2 < lVar19) {
                  dVar88 = (dVar83 * -6.0 +
                           pdVar14[lVar25 + lVar65 + lVar37 + (lVar77 - lVar19)] * 5.0 + dVar89) *
                           -0.25;
                }
                else {
                  dVar88 = pdVar14[lVar25 + lVar65 + lVar37 + ((lVar77 + -2) - lVar19)] * 0.1 +
                           dVar89 * -0.6666666666666666 +
                           dVar83 * 1.0666666666666667 +
                           pdVar14[lVar25 + lVar65 + lVar37 + (lVar77 - lVar19)] * -0.5;
                }
              }
              lVar22 = (long)(int)((int)lVar24 - uVar2);
              dVar90 = pdVar14[lVar25 + lVar22 + lVar65 + lVar37];
              dVar89 = (dVar90 - dVar89) + (dVar90 - dVar89);
              dVar86 = (dVar83 - dVar90) + (dVar83 - dVar90);
              dVar83 = 0.0;
              if (0.0 <= dVar86 * dVar89) {
                dVar83 = ABS(dVar89);
                dVar86 = ABS(dVar86);
                if (dVar86 <= dVar83) {
                  dVar83 = dVar86;
                }
              }
              dVar89 = pdVar14[lVar37 + lVar65 + (int)((int)(lVar28 + 1) - uVar3) * lVar72 + lVar22]
              ;
              dVar86 = pdVar14[lVar37 + lVar65 + (int)(~uVar3 + (int)lVar28) * lVar72 + lVar22];
              dVar84 = (dVar89 - dVar86) * 0.5;
              if ((lVar28 == lVar46) && (pBVar50->bc[1] - 3U < 2)) {
                if (lVar28 + 2 < (long)iVar29) {
                  dVar84 = pdVar14[lVar37 + lVar65 + ((lVar28 + 2) - lVar20) * lVar72 + lVar22] *
                           -0.1 + dVar89 * 0.6666666666666666 +
                                  dVar86 * -1.0666666666666667 + dVar90 * 0.5;
                }
                else {
                  dVar84 = (dVar86 * -6.0 + dVar90 * 5.0 + dVar89) * 0.25;
                }
              }
              if ((lVar28 == lVar48) && (pBVar50->bc[4] - 3U < 2)) {
                if (lVar28 + -2 < lVar20) {
                  dVar84 = (dVar89 * -6.0 + dVar90 * 5.0 + dVar86) * -0.25;
                }
                else {
                  dVar84 = pdVar14[lVar37 + lVar65 + ((lVar28 + -2) - lVar20) * lVar72 + lVar22] *
                           0.1 + dVar86 * -0.6666666666666666 +
                                 dVar89 * 1.0666666666666667 + dVar90 * -0.5;
                }
              }
              dVar86 = (dVar90 - dVar86) + (dVar90 - dVar86);
              dVar87 = (dVar89 - dVar90) + (dVar89 - dVar90);
              dVar89 = 0.0;
              if (0.0 <= dVar87 * dVar86) {
                dVar89 = ABS(dVar86);
                dVar87 = ABS(dVar87);
                if (dVar87 <= dVar89) {
                  dVar89 = dVar87;
                }
              }
              dVar86 = pdVar14[lVar25 + lVar22 + (int)((int)(lVar55 + 1) - uVar4) * lVar74 + lVar37]
              ;
              dVar87 = pdVar14[lVar25 + lVar22 + (int)(~uVar4 + (int)lVar55) * lVar74 + lVar37];
              dVar85 = (dVar86 - dVar87) * 0.5;
              if ((lVar55 == lVar47) && (pBVar50->bc[2] - 3U < 2)) {
                if ((long)iVar7 < lVar55 + 2) {
                  dVar85 = (dVar87 * -6.0 + dVar90 * 5.0 + dVar86) * 0.25;
                }
                else {
                  dVar85 = pdVar14[lVar25 + lVar22 + ((lVar55 + 2) - lVar21) * lVar74 + lVar37] *
                           -0.1 + dVar86 * 0.6666666666666666 +
                                  dVar87 * -1.0666666666666667 + dVar90 * 0.5;
                }
              }
              if ((lVar55 == lVar49) && (pBVar50->bc[5] - 3U < 2)) {
                if (lVar55 + -2 < lVar21) {
                  dVar85 = (dVar86 * -6.0 + dVar90 * 5.0 + dVar87) * -0.25;
                }
                else {
                  dVar85 = pdVar14[lVar25 + lVar22 + ((lVar55 + -2) - lVar21) * lVar74 + lVar37] *
                           0.1 + dVar87 * -0.6666666666666666 +
                                 dVar86 * 1.0666666666666667 + dVar90 * -0.5;
                }
              }
              dVar87 = (dVar90 - dVar87) + (dVar90 - dVar87);
              dVar93 = (dVar86 - dVar90) + (dVar86 - dVar90);
              dVar86 = 0.0;
              if (0.0 <= dVar93 * dVar87) {
                dVar86 = ABS(dVar87);
                dVar93 = ABS(dVar93);
                if (dVar93 <= dVar86) {
                  dVar86 = dVar93;
                }
              }
              dVar87 = ABS(dVar88);
              if (dVar83 <= ABS(dVar88)) {
                dVar87 = dVar83;
              }
              dVar87 = dVar87 * (double)((ulong)dVar88 & 0x8000000000000000 | 0x3ff0000000000000);
              dVar83 = ABS(dVar84);
              if (dVar89 <= ABS(dVar84)) {
                dVar83 = dVar89;
              }
              dVar83 = dVar83 * (double)((ulong)dVar84 & 0x8000000000000000 | 0x3ff0000000000000);
              dVar89 = ABS(dVar85);
              if (dVar86 <= ABS(dVar85)) {
                dVar89 = dVar86;
              }
              dVar89 = dVar89 * (double)((ulong)dVar85 & 0x8000000000000000 | 0x3ff0000000000000);
              if ((((dVar87 != 0.0) || (NAN(dVar87))) || (dVar83 != 0.0)) || (NAN(dVar83))) {
LAB_004605c1:
                dVar88 = dVar90;
                dVar86 = dVar90;
                for (lVar22 = -1; lVar22 != 2; lVar22 = lVar22 + 1) {
                  for (lVar56 = -1; lVar56 != 2; lVar56 = lVar56 + 1) {
                    for (lVar75 = 0; lVar75 != 3; lVar75 = lVar75 + 1) {
                      dVar84 = pdVar14[lVar37 + (iVar51 + (int)lVar22) * lVar74 +
                                                (iVar62 + (int)lVar56) * lVar72 +
                                                (long)(iVar68 + (int)lVar75)];
                      dVar85 = dVar84;
                      if (dVar86 <= dVar84) {
                        dVar85 = dVar86;
                      }
                      if (dVar84 <= dVar88) {
                        dVar84 = dVar88;
                      }
                      dVar88 = dVar84;
                      dVar86 = dVar85;
                    }
                  }
                }
                auVar91._0_8_ = ABS(dVar87) * (double)(iVar11 + -1);
                auVar91._8_8_ = ABS(dVar89) * (double)(iVar6 + -1);
                auVar92._8_8_ = (double)(iVar6 * 2);
                auVar92._0_8_ = (double)(iVar11 * 2);
                auVar92 = divpd(auVar91,auVar92);
                dVar84 = auVar92._8_8_ +
                         (ABS(dVar83) * (double)(iVar5 + -1)) / (double)(iVar5 * 2) + auVar92._0_8_;
                uVar66 = -(ulong)(dVar88 - dVar90 < dVar84);
                dVar88 = (double)(~uVar66 & 0x3ff0000000000000 |
                                 (ulong)((dVar88 - dVar90) / dVar84) & uVar66);
                if (dVar90 - dVar86 < dVar84 * dVar88) {
                  dVar88 = (dVar90 - dVar86) / dVar84;
                }
              }
              else {
                dVar88 = 1.0;
                if ((dVar89 != 0.0) || (NAN(dVar89))) goto LAB_004605c1;
              }
              lVar22 = lVar24 - lVar23;
              ccfab.super_BaseFab<double>.dptr[lVar73 + lVar34 + lVar22 + uVar27 * lVar70] =
                   dVar87 * dVar88;
              ccfab.super_BaseFab<double>.dptr[lVar73 + lVar34 + lVar22 + (ncomp + iVar31) * lVar70]
                   = dVar83 * dVar88;
              ccfab.super_BaseFab<double>.dptr
              [lVar73 + lVar34 + lVar22 + (ncomp * 2 + iVar31) * lVar70] = dVar89 * dVar88;
              iVar68 = iVar68 + 1;
              lVar22 = lVar28 + 1;
              lVar24 = lVar24 + 1;
            } while (result.bigend.vect[0] + 1 != iVar52);
          }
        }
      }
    }
  }
  else {
    lVar77 = (long)result.smallend.vect[1];
    lVar60 = (long)result.smallend.vect[2];
    local_3f0 = 0;
    if (0 < ncomp) {
      local_3f0 = (ulong)(uint)ncomp;
    }
    lVar65 = lVar60 * 8;
    lVar22 = crse_comp * lVar22;
    lVar24 = (lVar65 + lVar22 * 8 + lVar21 * -8) * lVar73;
    lVar56 = lVar24 + lVar77 * 8 + lVar20 * -8;
    lVar34 = (lVar22 + lVar60) * 8 + lVar21 * -8;
    lVar25 = lVar43 * 8 + lVar19 * -8;
    pdVar58 = pdVar14 + -lVar19;
    lVar28 = lVar77 * 8 + lVar20 * -8;
    local_298 = ((lVar65 + (ncomp * 2) * lVar55 * 8 + lVar42 * -8) * lVar37 + lVar77 * 8 +
                lVar64 * -8) * lVar80 + lVar23 * -8 + (long)ccfab.super_BaseFab<double>.dptr;
    lVar65 = ((lVar65 + ncomp * lVar55 * 8 + lVar42 * -8) * lVar37 + lVar77 * 8 + lVar64 * -8) *
             lVar80 + lVar23 * -8 + (long)ccfab.super_BaseFab<double>.dptr;
    lVar75 = (lVar77 * 8 + (lVar60 - lVar42) * lVar37 * 8 + lVar64 * -8) * lVar80 + lVar23 * -8 +
             (long)ccfab.super_BaseFab<double>.dptr;
    lVar64 = lVar56 * lVar72 + lVar19 * -8 + (long)pdVar14;
    local_160 = (lVar56 + 0x10) * lVar72 + lVar19 * -8 + (long)pdVar14;
    lVar55 = (lVar56 + -0x10) * lVar72 + lVar19 * -8 + (long)pdVar14;
    local_168 = ((lVar34 + 0x10) * lVar73 + lVar77 * 8 + lVar20 * -8) * lVar72 + lVar19 * -8 +
                (long)pdVar14;
    local_170 = ((lVar34 + -0x10) * lVar73 + lVar77 * 8 + lVar20 * -8) * lVar72 + lVar19 * -8 +
                (long)pdVar14;
    iVar51 = result.smallend.vect[2] - uVar4;
    iVar29 = iVar51 + -1;
    pdVar81 = (double *)(lVar56 * lVar72 + (long)pdVar14);
    lVar23 = lVar38 * 8;
    lVar37 = lVar80 * 8;
    lVar42 = lVar74 * 8;
    local_378 = pdVar58;
    while (iVar51 = iVar51 + 1, lVar60 <= result.bigend.vect[2]) {
      local_308 = (double *)
                  (((lVar22 * 8 + (long)iVar29 * 8) * lVar73 + lVar28) * lVar72 + (long)pdVar58);
      local_310 = (double *)
                  (((lVar22 * 8 + (long)iVar51 * 8) * lVar73 + lVar28) * lVar72 + (long)pdVar58);
      local_320 = local_170;
      local_328 = local_168;
      local_338 = local_160;
      lVar34 = local_298;
      lVar56 = lVar65;
      lVar76 = lVar75;
      local_340 = lVar64;
      local_330 = lVar55;
      local_318 = pdVar81;
      iVar68 = (result.smallend.vect[1] - uVar3) + -1;
      iVar62 = result.smallend.vect[1] - uVar3;
      for (lVar78 = lVar77; iVar62 = iVar62 + 1, lVar78 <= result.bigend.vect[1];
          lVar78 = lVar78 + 1) {
        if (result.smallend.vect[0] <= result.bigend.vect[0]) {
          iVar40 = ~uVar2 + result.smallend.vect[0];
          iVar36 = result.smallend.vect[0] + -2;
          iVar30 = result.smallend.vect[0] + 2;
          iVar52 = result.smallend.vect[0] - uVar2;
          iVar17 = result.smallend.vect[0];
          do {
            iVar52 = iVar52 + 1;
            lVar26 = (long)iVar17;
            lVar57 = lVar26 * 8;
            lVar1 = local_340 + lVar26 * 8;
            lVar39 = 0;
            uVar27 = local_3f0;
            lVar41 = lVar57;
            piVar61 = pBVar16->bc + 5;
            dVar83 = 1.0;
            dVar89 = 1.0;
            dVar88 = 1.0;
            while (bVar82 = uVar27 != 0, uVar27 = uVar27 - 1, uVar66 = local_3f0, bVar82) {
              dVar90 = *(double *)((long)local_318 + lVar39 + (long)iVar52 * 8);
              dVar86 = *(double *)((long)local_318 + lVar39 + (long)iVar40 * 8);
              dVar84 = (dVar90 - dVar86) * 0.5;
              if ((iVar11 == iVar17) && (((BCRec *)(piVar61 + -5))->bc[0] - 3U < 2)) {
                if (iVar5 < iVar17 + 2) {
                  dVar84 = (dVar86 * -6.0 + *(double *)(lVar1 + lVar39) * 5.0 + dVar90) * 0.25;
                }
                else {
                  dVar84 = *(double *)(local_340 + (long)iVar30 * 8 + lVar39) * -0.1 +
                           dVar90 * 0.6666666666666666 +
                           dVar86 * -1.0666666666666667 + *(double *)(lVar1 + lVar39) * 0.5;
                }
              }
              if ((iVar31 == iVar17) && (piVar61[-2] - 3U < 2)) {
                if (iVar17 + -2 < (int)uVar2) {
                  dVar84 = (dVar90 * -6.0 + *(double *)(lVar1 + lVar39) * 5.0 + dVar86) * -0.25;
                }
                else {
                  dVar84 = *(double *)(local_340 + (long)iVar36 * 8 + lVar39) * 0.1 +
                           dVar86 * -0.6666666666666666 +
                           dVar90 * 1.0666666666666667 + *(double *)(lVar1 + lVar39) * -0.5;
                }
              }
              dVar86 = *(double *)(lVar1 + lVar39) - dVar86;
              dVar90 = dVar90 - *(double *)(lVar1 + lVar39);
              dVar86 = dVar86 + dVar86;
              dVar90 = dVar90 + dVar90;
              dVar87 = 0.0;
              if (0.0 <= dVar90 * dVar86) {
                dVar87 = ABS(dVar86);
                dVar90 = ABS(dVar90);
                if (dVar90 <= dVar87) {
                  dVar87 = dVar90;
                }
              }
              if ((dVar84 != 0.0) || (dVar90 = dVar88, NAN(dVar84))) {
                dVar90 = ABS(dVar84);
                if (dVar87 <= ABS(dVar84)) {
                  dVar90 = dVar87;
                }
                dVar90 = (dVar90 * (double)((ulong)dVar84 & 0x8000000000000000 | 0x3ff0000000000000)
                         ) / dVar84;
                if (dVar88 <= dVar90) {
                  dVar90 = dVar88;
                }
              }
              *(double *)(lVar76 + lVar41) = dVar84;
              dVar88 = *(double *)
                        ((long)local_378 +
                        lVar39 + lVar26 * 8 + (lVar24 + (long)iVar62 * 8) * lVar72);
              dVar86 = *(double *)
                        ((long)local_378 +
                        lVar39 + lVar26 * 8 + (lVar24 + (long)iVar68 * 8) * lVar72);
              dVar84 = (dVar88 - dVar86) * 0.5;
              if ((lVar78 == lVar46) && (piVar61[-4] - 3U < 2)) {
                if ((long)iVar6 < lVar78 + 2) {
                  dVar84 = (dVar86 * -6.0 + *(double *)(lVar1 + lVar39) * 5.0 + dVar88) * 0.25;
                }
                else {
                  dVar84 = *(double *)(local_338 + lVar26 * 8 + lVar39) * -0.1 +
                           dVar88 * 0.6666666666666666 +
                           dVar86 * -1.0666666666666667 + *(double *)(lVar1 + lVar39) * 0.5;
                }
              }
              if (lVar78 == lVar48) {
                dVar87 = *(double *)(lVar1 + lVar39);
                if (piVar61[-1] - 3U < 2) {
                  if (lVar78 + -2 < lVar20) {
                    dVar84 = (dVar88 * -6.0 + dVar87 * 5.0 + dVar86) * -0.25;
                  }
                  else {
                    dVar84 = *(double *)(local_330 + lVar26 * 8 + lVar39) * 0.1 +
                             dVar86 * -0.6666666666666666 +
                             dVar88 * 1.0666666666666667 + dVar87 * -0.5;
                  }
                }
              }
              else {
                dVar87 = *(double *)(lVar1 + lVar39);
              }
              dVar86 = (dVar87 - dVar86) + (dVar87 - dVar86);
              dVar87 = (dVar88 - dVar87) + (dVar88 - dVar87);
              dVar88 = 0.0;
              if (0.0 <= dVar87 * dVar86) {
                dVar88 = ABS(dVar86);
                dVar87 = ABS(dVar87);
                if (dVar87 <= dVar88) {
                  dVar88 = dVar87;
                }
              }
              if ((dVar84 != 0.0) || (dVar86 = dVar89, NAN(dVar84))) {
                dVar86 = ABS(dVar84);
                if (dVar88 <= ABS(dVar84)) {
                  dVar86 = dVar88;
                }
                dVar86 = (dVar86 * (double)((ulong)dVar84 & 0x8000000000000000 | 0x3ff0000000000000)
                         ) / dVar84;
                if (dVar89 <= dVar86) {
                  dVar86 = dVar89;
                }
              }
              *(double *)(lVar56 + lVar41) = dVar84;
              dVar89 = *(double *)((long)local_310 + lVar39 + lVar26 * 8);
              dVar88 = *(double *)((long)local_308 + lVar39 + lVar26 * 8);
              dVar84 = (dVar89 - dVar88) * 0.5;
              if ((lVar60 == lVar47) && (piVar61[-3] - 3U < 2)) {
                if ((long)iVar7 < lVar60 + 2) {
                  dVar84 = (dVar88 * -6.0 + *(double *)(lVar1 + lVar39) * 5.0 + dVar89) * 0.25;
                }
                else {
                  dVar84 = *(double *)(local_328 + lVar26 * 8 + lVar39) * -0.1 +
                           dVar89 * 0.6666666666666666 +
                           dVar88 * -1.0666666666666667 + *(double *)(lVar1 + lVar39) * 0.5;
                }
              }
              if (lVar60 == lVar49) {
                dVar87 = *(double *)(lVar1 + lVar39);
                if (*piVar61 - 3U < 2) {
                  if (lVar60 + -2 < lVar21) {
                    dVar84 = (dVar89 * -6.0 + dVar87 * 5.0 + dVar88) * -0.25;
                  }
                  else {
                    dVar84 = *(double *)(local_320 + lVar26 * 8 + lVar39) * 0.1 +
                             dVar88 * -0.6666666666666666 +
                             dVar89 * 1.0666666666666667 + dVar87 * -0.5;
                  }
                }
              }
              else {
                dVar87 = *(double *)(lVar1 + lVar39);
              }
              dVar88 = (dVar87 - dVar88) + (dVar87 - dVar88);
              dVar87 = (dVar89 - dVar87) + (dVar89 - dVar87);
              dVar89 = 0.0;
              if (0.0 <= dVar87 * dVar88) {
                dVar89 = ABS(dVar88);
                dVar87 = ABS(dVar87);
                if (dVar87 <= dVar89) {
                  dVar89 = dVar87;
                }
              }
              if ((dVar84 != 0.0) || (dVar88 = dVar83, NAN(dVar84))) {
                dVar88 = ABS(dVar84);
                if (dVar89 <= ABS(dVar84)) {
                  dVar88 = dVar89;
                }
                dVar88 = (dVar88 * (double)((ulong)dVar84 & 0x8000000000000000 | 0x3ff0000000000000)
                         ) / dVar84;
                if (dVar83 <= dVar88) {
                  dVar88 = dVar83;
                }
              }
              *(double *)(lVar34 + lVar41) = dVar84;
              lVar41 = lVar41 + lVar70 * 8;
              piVar61 = piVar61 + 6;
              lVar39 = lVar39 + lVar33 * 8;
              dVar83 = dVar88;
              dVar89 = dVar86;
              dVar88 = dVar90;
            }
            while (uVar66 != 0) {
              *(double *)(lVar76 + lVar57) = *(double *)(lVar76 + lVar57) * dVar88;
              *(double *)(lVar56 + lVar57) = *(double *)(lVar56 + lVar57) * dVar89;
              *(double *)(lVar34 + lVar57) = *(double *)(lVar34 + lVar57) * dVar83;
              lVar57 = lVar57 + lVar70 * 8;
              uVar66 = uVar66 - 1;
            }
            iVar30 = iVar30 + 1;
            iVar36 = iVar36 + 1;
            iVar40 = iVar40 + 1;
            bVar82 = iVar17 != result.bigend.vect[0];
            iVar17 = iVar17 + 1;
          } while (bVar82);
        }
        lVar34 = lVar34 + lVar37;
        lVar56 = lVar56 + lVar37;
        lVar76 = lVar76 + lVar37;
        local_340 = local_340 + lVar25;
        local_338 = local_338 + lVar25;
        local_330 = local_330 + lVar25;
        local_328 = local_328 + lVar25;
        local_320 = local_320 + lVar25;
        local_308 = local_308 + (lVar43 - lVar19);
        local_310 = local_310 + (lVar43 - lVar19);
        iVar68 = iVar68 + 1;
        local_318 = local_318 + (lVar43 - lVar19);
      }
      local_298 = local_298 + lVar23;
      lVar65 = lVar65 + lVar23;
      lVar75 = lVar75 + lVar23;
      lVar64 = lVar64 + lVar42;
      local_160 = local_160 + lVar42;
      lVar55 = lVar55 + lVar42;
      local_168 = local_168 + lVar42;
      local_170 = local_170 + lVar42;
      iVar29 = iVar29 + 1;
      local_378 = local_378 + lVar74;
      pdVar81 = pdVar81 + lVar74;
      lVar60 = lVar60 + 1;
    }
  }
  local_288 = ncomp * 2;
  iVar5 = ratio->vect[0];
  iVar6 = ratio->vect[1];
  iVar7 = ratio->vect[2];
  uVar13 = (fine_region->smallend).vect[0];
  uVar66 = (ulong)(fine_region->smallend).vect[1];
  uVar71 = (ulong)(fine_region->smallend).vect[2];
  iVar11 = (fine_region->bigend).vect[0];
  iVar31 = (fine_region->bigend).vect[1];
  iVar29 = (fine_region->bigend).vect[2];
  for (uVar27 = 0; uVar27 != local_3f0; uVar27 = uVar27 + 1) {
    local_418 = (double *)
                ((long)pdVar15 +
                (((long)fine_comp * (long)((iVar12 - iVar10) + 1) * 8 +
                 uVar71 * 8 + (long)iVar10 * -8) * lVar45 + uVar66 * 8 + (long)iVar9 * -8) * lVar44
                + (long)(int)uVar13 * 8 + (long)iVar8 * -8);
    iVar51 = (int)uVar27;
    for (uVar35 = uVar71; (long)uVar35 <= (long)iVar29; uVar35 = uVar35 + 1) {
      uVar32 = (uint)uVar35;
      local_440 = local_418;
      for (uVar54 = uVar66; (long)uVar54 <= (long)iVar31; uVar54 = uVar54 + 1) {
        if ((int)uVar13 <= iVar11) {
          uVar53 = (uint)uVar54;
          pdVar58 = local_440;
          uVar67 = (long)(int)uVar13;
          uVar59 = ~uVar13;
          do {
            uVar63 = (uint)uVar67;
            if (iVar5 == 4) {
              if ((long)uVar67 < 0) {
                uVar69 = (int)uVar63 >> 2;
              }
              else {
                uVar69 = uVar63 >> 2;
              }
            }
            else if (iVar5 == 2) {
              if ((long)uVar67 < 0) {
                uVar69 = (int)uVar63 >> 1;
              }
              else {
                uVar69 = uVar63 >> 1;
              }
            }
            else {
              uVar69 = uVar63;
              if (iVar5 != 1) {
                if ((long)uVar67 < 0) {
                  uVar69 = ~((int)uVar59 / iVar5);
                }
                else {
                  uVar69 = (uint)((long)((ulong)(uint)((int)uVar63 >> 0x1f) << 0x20 |
                                        uVar67 & 0xffffffff) / (long)iVar5);
                }
              }
            }
            uVar79 = uVar53;
            if (((iVar6 != 1) && (uVar79 = (int)uVar53 >> 2, iVar6 != 4)) &&
               (uVar79 = (int)uVar53 >> 1, iVar6 != 2)) {
              if ((long)uVar54 < 0) {
                uVar79 = ~((int)~uVar53 / iVar6);
              }
              else {
                uVar79 = (uint)((long)((ulong)(uint)((int)uVar53 >> 0x1f) << 0x20 |
                                      uVar54 & 0xffffffff) / (long)iVar6);
              }
            }
            uVar18 = uVar32;
            if (((iVar7 != 1) && (uVar18 = (int)uVar32 >> 2, iVar7 != 4)) &&
               (uVar18 = (int)uVar32 >> 1, iVar7 != 2)) {
              if ((long)uVar35 < 0) {
                uVar18 = ~((int)~uVar32 / iVar7);
              }
              else {
                uVar18 = (uint)((long)((ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 |
                                      uVar35 & 0xffffffff) / (long)iVar7);
              }
            }
            lVar20 = (long)(int)(uVar69 - ccfab.super_BaseFab<double>.domain.smallend.vect[0]);
            lVar21 = (int)(uVar79 - ccfab.super_BaseFab<double>.domain.smallend.vect[1]) * lVar80;
            lVar19 = (int)(uVar18 - ccfab.super_BaseFab<double>.domain.smallend.vect[2]) * lVar38;
            *pdVar58 = (((double)(int)(uVar32 - uVar18 * iVar7) + 0.5) / (double)iVar7 + -0.5) *
                       ccfab.super_BaseFab<double>.dptr
                       [lVar21 + lVar20 + lVar19 + (local_288 + iVar51) * lVar70] +
                       (((double)(int)(uVar53 - uVar79 * iVar6) + 0.5) / (double)iVar6 + -0.5) *
                       ccfab.super_BaseFab<double>.dptr
                       [lVar21 + lVar20 + lVar19 + (ncomp + iVar51) * lVar70] +
                       (((double)(int)(-iVar5 * uVar69 + uVar63) + 0.5) / (double)iVar5 + -0.5) *
                       ccfab.super_BaseFab<double>.dptr[lVar21 + lVar20 + lVar19 + uVar27 * lVar70]
                       + pdVar14[(int)(uVar79 - uVar3) * lVar72 +
                                 (long)(int)(uVar69 - uVar2) +
                                 (int)(uVar18 - uVar4) * lVar74 + (crse_comp + iVar51) * lVar33];
            uVar67 = uVar67 + 1;
            pdVar58 = pdVar58 + 1;
            uVar59 = uVar59 - 1;
          } while (iVar11 + 1 != (int)uVar67);
        }
        local_440 = local_440 + lVar44;
      }
      local_418 = local_418 + lVar45 * lVar44;
    }
    fine_comp = fine_comp + 1;
  }
  Gpu::Elixir::~Elixir(&cceli);
  BaseFab<double>::~BaseFab(&ccfab.super_BaseFab<double>);
  Gpu::AsyncArray<amrex::BCRec,_0>::~AsyncArray(&async_bcr);
  return;
}

Assistant:

void
CellConservativeLinear::interp (const FArrayBox& crse,
                                int              crse_comp,
                                FArrayBox&       fine,
                                int              fine_comp,
                                int              ncomp,
                                const Box&       fine_region,
                                const IntVect&   ratio,
                                const Geometry&  crse_geom,
                                const Geometry&  fine_geom,
                                Vector<BCRec> const& bcr,
                                int              /*actual_comp*/,
                                int              /*actual_state*/,
                                RunOn             runon)
{
    BL_PROFILE("CellConservativeLinear::interp()");
    BL_ASSERT(bcr.size() >= ncomp);

    AMREX_ASSERT(fine.box().contains(fine_region));

    bool run_on_gpu = (runon == RunOn::Gpu && Gpu::inLaunchRegion());

    Box const& cdomain = crse_geom.Domain();
    amrex::ignore_unused(fine_geom);

    Array4<Real const> const& crsearr = crse.const_array();
    Array4<Real> const& finearr = fine.array();

    const Box& crse_region = CoarseBox(fine_region,ratio);
    const Box& cslope_bx = amrex::grow(crse_region,-1);

    AsyncArray<BCRec> async_bcr(bcr.data(), (run_on_gpu) ? ncomp : 0);
    BCRec const* bcrp = (run_on_gpu) ? async_bcr.data() : bcr.data();

    FArrayBox ccfab(cslope_bx, ncomp*AMREX_SPACEDIM);
    Elixir cceli;
    if (run_on_gpu) cceli = ccfab.elixir();
    Array4<Real> const& tmp = ccfab.array();
    Array4<Real const> const& ctmp = ccfab.const_array();

#if (AMREX_SPACEDIM == 1)
    if (crse_geom.IsSPHERICAL()) {
        Real drf = fine_geom.CellSize(0);
        Real rlo = fine_geom.Offset(0);
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                amrex::ignore_unused(j,k);
                mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp, crsearr, crse_comp, ncomp,
                                                    cdomain, ratio, bcrp, drf, rlo);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            amrex::ignore_unused(j,k);
            mf_cell_cons_lin_interp_sph(i, n, finearr, fine_comp, ctmp,
                                        crsearr, crse_comp, ncomp, ratio, drf, rlo);
        });
    } else
#elif (AMREX_SPACEDIM == 2)
    if (crse_geom.IsRZ()) {
        Real drf = fine_geom.CellSize(0);
        Real rlo = fine_geom.Offset(0);
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                amrex::ignore_unused(k);
                mf_cell_cons_lin_interp_mcslope_rz(i, j, n, tmp, crsearr, crse_comp, ncomp,
                                                   cdomain, ratio, bcrp, drf, rlo);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            amrex::ignore_unused(k);
            mf_cell_cons_lin_interp_rz(i, j, n, finearr, fine_comp, ctmp,
                                       crsearr, crse_comp, ncomp, ratio, drf, rlo);
        });
    } else
#endif
    {
        if (do_linear_limiting) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cslope_bx, i, j, k,
            {
                mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, bcrp);
            });
        } else {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, cslope_bx, ncomp, i, j, k, n,
            {
                mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp, crsearr, crse_comp, ncomp,
                                                cdomain, ratio, bcrp);
            });
        }

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon, fine_region, ncomp, i, j, k, n,
        {
            mf_cell_cons_lin_interp(i,j,k,n, finearr, fine_comp, ctmp,
                                    crsearr, crse_comp, ncomp, ratio);
        });
    }
}